

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_export(Integer s_a,char *file)

{
  size_t sVar1;
  uint uVar2;
  long lVar3;
  _sparse_array *p_Var4;
  Integer IVar5;
  void *x;
  int iVar6;
  Integer IVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  FILE *__stream;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  char op [2];
  Integer lo;
  Integer hi;
  char frmt [32];
  int *idx;
  Integer ld;
  Integer jhi;
  Integer jlo;
  char local_162 [2];
  long local_160;
  long local_158;
  size_t local_150;
  Integer local_148;
  void *local_140;
  void *local_138;
  Integer local_130;
  void *local_128;
  void *local_120;
  void *local_118;
  long local_110;
  char local_108 [6];
  undefined8 auStack_102 [4];
  long local_e0;
  int *local_d8;
  void *local_d0;
  void *local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  void *local_a8;
  Integer local_a0;
  char *local_98;
  Integer local_90;
  long local_88;
  long local_80;
  char *local_78;
  long local_70;
  long local_68;
  Integer local_60;
  long local_58;
  long local_50;
  char *local_48;
  Integer local_40;
  Integer local_38;
  
  lVar17 = s_a + 1000;
  local_a0 = SPA[lVar17].size;
  uVar2 = (uint)SPA[lVar17].type;
  local_b0 = (ulong)(uint)SPA[lVar17].idx_size;
  local_98 = file;
  local_60 = s_a;
  IVar7 = pnga_pgroup_nodeid(SPA[lVar17].grp);
  local_148 = pnga_pgroup_nnodes(SPA[lVar17].grp);
  bVar19 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar19) {
    pnga_pgroup_sync(SPA[lVar17].grp);
  }
  local_e0 = lVar17 * 200;
  if (local_148 < 1) {
    lVar11 = 0;
  }
  else {
    lVar14 = 0;
    lVar11 = 0;
    do {
      pnga_distribution(SPA[lVar17].g_data,lVar14,&local_160,&local_158);
      if (lVar11 < local_158) {
        lVar11 = local_158;
      }
      lVar14 = lVar14 + 1;
    } while (local_148 != lVar14);
  }
  IVar5 = local_148;
  sVar1 = local_148 * 4;
  pvVar8 = malloc(sVar1);
  local_138 = malloc(sVar1);
  pvVar9 = malloc(sVar1);
  if (0 < IVar5) {
    memset(pvVar8,0,sVar1);
    memset(local_138,0,sVar1);
    memset(pvVar9,0,sVar1);
  }
  lVar17 = local_e0;
  x = local_138;
  IVar5 = local_148;
  p_Var4 = SPA;
  *(undefined4 *)((long)pvVar8 + IVar7 * 4) = *(undefined4 *)((long)&SPA->ilo + local_e0);
  *(undefined4 *)((long)local_138 + IVar7 * 4) = *(undefined4 *)((long)&p_Var4->ihi + local_e0);
  *(undefined4 *)((long)pvVar9 + IVar7 * 4) = *(undefined4 *)((long)&p_Var4->nblocks + local_e0);
  local_162[0] = '+';
  local_162[1] = '\0';
  local_150 = sVar1;
  local_d0 = pvVar8;
  pnga_pgroup_gop(*(Integer *)((long)&p_Var4->grp + local_e0),0x3e9,pvVar8,local_148,local_162);
  pnga_pgroup_gop(*(Integer *)((long)&SPA->grp + lVar17),0x3e9,x,IVar5,local_162);
  local_140 = pvVar9;
  pnga_pgroup_gop(*(Integer *)((long)&SPA->grp + lVar17),0x3e9,pvVar9,IVar5,local_162);
  local_d8 = (int *)malloc(local_150);
  pvVar8 = local_140;
  if (IVar5 < 1) {
    lVar14 = 0;
  }
  else {
    lVar10 = 0;
    lVar14 = 0;
    do {
      lVar14 = lVar14 + *(int *)((long)local_140 + lVar10 * 4);
      lVar10 = lVar10 + 1;
    } while (IVar5 != lVar10);
  }
  sVar1 = lVar14 * 4;
  local_120 = malloc(sVar1);
  local_128 = malloc(sVar1);
  *local_d8 = 0;
  if (1 < local_148) {
    iVar6 = *local_d8;
    lVar10 = 0;
    do {
      iVar6 = iVar6 + *(int *)((long)pvVar8 + lVar10 * 4);
      local_d8[lVar10 + 1] = iVar6;
      lVar10 = lVar10 + 1;
    } while (local_148 + -1 != lVar10);
  }
  if (0 < lVar14) {
    memset(local_120,0,sVar1);
    memset(local_128,0,sVar1);
  }
  lVar10 = (long)*(int *)((long)local_140 + IVar7 * 4);
  if (0 < lVar10) {
    lVar18 = *(long *)((long)&SPA->blkidx + lVar17);
    lVar3 = *(long *)((long)&SPA->blksize + lVar17);
    iVar6 = local_d8[IVar7];
    lVar16 = 0;
    do {
      *(undefined4 *)((long)local_120 + lVar16 * 4 + (long)iVar6 * 4) =
           *(undefined4 *)(lVar18 + lVar16 * 8);
      *(undefined4 *)((long)local_128 + lVar16 * 4 + (long)iVar6 * 4) =
           *(undefined4 *)(lVar3 + lVar16 * 8);
      lVar16 = lVar16 + 1;
    } while (lVar10 != lVar16);
  }
  pnga_pgroup_gop(*(Integer *)((long)&SPA->grp + lVar17),0x3e9,local_120,lVar14,local_162);
  pnga_pgroup_gop(*(Integer *)((long)&SPA->grp + lVar17),0x3e9,local_128,lVar14,local_162);
  pvVar9 = local_d0;
  pvVar8 = local_138;
  if ((int)local_b0 == 4) {
    builtin_strncpy(local_108,"%d %d",5);
    lVar14 = 5;
  }
  else {
    local_108[4] = 0x25;
    stack0xfffffffffffffefd = 0x646c;
    local_108[0] = '%';
    local_108[1] = 'l';
    local_108[2] = 'd';
    local_108[3] = ' ';
    lVar14 = 7;
  }
  uVar12 = (uint)lVar14;
  pcVar15 = local_108 + lVar14;
  if (uVar2 - 0x3eb < 2) {
    builtin_strncpy(local_108 + lVar14," %14.6e",7);
    uVar12 = 7;
  }
  else if (uVar2 == 0x3ea) {
    builtin_strncpy(local_108 + lVar14," %ld",4);
    uVar12 = 4;
  }
  else if (uVar2 == 0x3e9) {
    local_108[lVar14 + 2] = 'd';
    pcVar15[0] = ' ';
    pcVar15[1] = '%';
    uVar12 = 3;
  }
  else if ((uVar2 & 0xfffffffe) == 0x3ee) {
    *(undefined8 *)((long)auStack_102 + lVar14) = 0x65362e3431252065;
    builtin_strncpy(local_108 + lVar14," %14.6e ",8);
    uVar12 = 0xe;
  }
  (pcVar15 + uVar12)[0] = '\n';
  (pcVar15 + uVar12)[1] = '\0';
  if (IVar7 == 0) {
    __stream = fopen(local_98,"w");
    fprintf(__stream,"%%MatrixMarket matrix coordinate real general\n");
    fprintf(__stream,"%ld %ld %ld\n",*(undefined8 *)((long)&SPA->idim + lVar17),
            *(undefined8 *)((long)&SPA->jdim + lVar17),lVar11);
    if (0 < local_148) {
      local_68 = (long)(int)local_a0;
      local_70 = (long)(int)local_b0;
      IVar7 = 0;
      do {
        local_90 = 1;
        local_130 = IVar7;
        pnga_distribution(*(Integer *)((long)&SPA->g_data + lVar17),IVar7,&local_160,&local_158);
        local_118 = malloc(((local_158 - local_160) + 1) * local_68);
        pnga_get(*(Integer *)((long)&SPA->g_data + lVar17),&local_160,&local_158,local_118,&local_90
                );
        pnga_distribution(*(Integer *)((long)&SPA->g_i + lVar17),local_130,&local_160,&local_158);
        lVar11 = local_70;
        local_a8 = malloc(((local_158 - local_160) + 1) * local_70);
        pnga_get(*(Integer *)((long)&SPA->g_i + lVar17),&local_160,&local_158,local_a8,&local_90);
        pnga_distribution(*(Integer *)((long)&SPA->g_j + lVar17),local_130,&local_160,&local_158);
        local_c8 = malloc(((local_158 - local_160) + 1) * lVar11);
        IVar7 = local_130;
        pnga_get(*(Integer *)((long)&SPA->g_j + lVar17),&local_160,&local_158,local_c8,&local_90);
        iVar6 = *(int *)((long)pvVar9 + IVar7 * 4);
        iVar13 = *(int *)((long)pvVar8 + IVar7 * 4) - iVar6;
        if (0 < iVar13 + 1) {
          local_78 = (char *)(ulong)*(uint *)((long)local_140 + IVar7 * 4);
          local_58 = (long)(iVar13 + 2);
          local_80 = (long)local_118 + 8;
          local_88 = (long)local_118 + 4;
          local_110 = 0;
          do {
            if (0 < (int)local_78) {
              local_50 = (long)local_d8[local_130];
              lVar17 = local_110 + iVar6 + 1;
              pcVar15 = (char *)0x0;
              iVar6 = 0;
              do {
                local_48 = pcVar15 + local_50;
                pnga_sprs_array_column_distribution
                          (local_60,(long)*(int *)((long)local_120 + (long)local_48 * 4),&local_38,
                           &local_40);
                pvVar9 = local_c8;
                pvVar8 = local_118;
                lVar14 = (long)pcVar15 * local_58 + local_110;
                local_a0 = CONCAT44(local_a0._4_4_,iVar6);
                lVar11 = (long)iVar6;
                local_98 = pcVar15;
                if ((int)local_b0 == 4) {
                  iVar6 = *(int *)((long)local_a8 + lVar14 * 4);
                  lVar10 = (long)iVar6;
                  iVar13 = *(int *)((long)local_a8 + lVar14 * 4 + 4);
                  if (iVar6 < iVar13) {
                    lVar14 = lVar10 * 4 + lVar11 * 4;
                    lVar18 = iVar13 - lVar10;
                    local_b8 = lVar10 * 0x10 + lVar11 * 8 + local_80;
                    local_c0 = lVar11 * 4 + lVar10 * 8 + local_88;
                    local_150 = lVar10 * 8 + lVar11 * 8 + (long)local_118;
                    lVar11 = 0;
                    do {
                      if (uVar2 == 0x3eb) {
                        iVar6 = *(int *)((long)pvVar9 + lVar11 + lVar14);
                        dVar20 = (double)*(float *)((long)pvVar8 + lVar11 + lVar14);
LAB_0014286d:
                        fprintf(__stream,local_108,dVar20,lVar17,(ulong)(iVar6 + 1));
                        goto switchD_001428a9_caseD_3eb;
                      }
                      if (uVar2 == 0x3ec) {
                        dVar20 = *(double *)(local_150 + lVar11 * 2);
                        iVar6 = *(int *)((long)pvVar9 + lVar11 + lVar14);
                        goto LAB_0014286d;
                      }
                      switch(uVar2) {
                      case 0x3e9:
                        fprintf(__stream,local_108,lVar17,
                                (ulong)(*(int *)((long)pvVar9 + lVar11 + lVar14) + 1),
                                (ulong)*(uint *)((long)pvVar8 + lVar11 + lVar14));
                        break;
                      case 0x3ea:
                        fprintf(__stream,local_108,lVar17,
                                (ulong)(*(int *)((long)pvVar9 + lVar11 + lVar14) + 1),
                                *(undefined8 *)(local_150 + lVar11 * 2));
                        break;
                      case 0x3ee:
                        iVar6 = *(int *)((long)pvVar9 + lVar11 + lVar14);
                        dVar20 = (double)*(float *)(local_c0 + -4 + lVar11 * 2);
                        dVar21 = (double)*(float *)(local_c0 + lVar11 * 2);
                        goto LAB_0014292d;
                      case 0x3ef:
                        dVar20 = *(double *)(local_b8 + -8 + lVar11 * 4);
                        dVar21 = *(double *)(local_b8 + lVar11 * 4);
                        iVar6 = *(int *)((long)pvVar9 + lVar11 + lVar14);
LAB_0014292d:
                        fprintf(__stream,local_108,dVar20,dVar21,lVar17,(ulong)(iVar6 + 1));
                      }
switchD_001428a9_caseD_3eb:
                      lVar11 = lVar11 + 4;
                      lVar18 = lVar18 + -1;
                    } while (lVar18 != 0);
                  }
                }
                else {
                  lVar10 = *(long *)((long)local_a8 + lVar14 * 8);
                  lVar14 = *(long *)((long)local_a8 + lVar14 * 8 + 8);
                  lVar18 = lVar14 - lVar10;
                  if (lVar18 != 0 && lVar10 <= lVar14) {
                    lVar14 = lVar11 * 8 + lVar10 * 8;
                    local_b8 = lVar10 * 0x10 + lVar11 * 8 + local_80;
                    local_c0 = lVar11 * 4 + lVar10 * 8 + local_88;
                    local_150 = lVar14 + (long)local_118;
                    lVar11 = lVar11 * 4 + lVar10 * 4;
                    lVar10 = 0;
                    do {
                      if (uVar2 == 0x3eb) {
                        lVar3 = *(long *)((long)pvVar9 + lVar10 * 2 + lVar14);
                        dVar20 = (double)*(float *)((long)pvVar8 + lVar10 + lVar11);
LAB_001429f5:
                        fprintf(__stream,local_108,dVar20,lVar17,lVar3 + 1);
                        goto switchD_00142a31_caseD_3eb;
                      }
                      if (uVar2 == 0x3ec) {
                        dVar20 = *(double *)(local_150 + lVar10 * 2);
                        lVar3 = *(long *)((long)pvVar9 + lVar10 * 2 + lVar14);
                        goto LAB_001429f5;
                      }
                      switch(uVar2) {
                      case 0x3e9:
                        fprintf(__stream,local_108,lVar17,
                                *(long *)((long)pvVar9 + lVar10 * 2 + lVar14) + 1,
                                (ulong)*(uint *)((long)pvVar8 + lVar10 + lVar11));
                        break;
                      case 0x3ea:
                        fprintf(__stream,local_108,lVar17,
                                *(long *)((long)pvVar9 + lVar10 * 2 + lVar14) + 1,
                                *(undefined8 *)(local_150 + lVar10 * 2));
                        break;
                      case 0x3ee:
                        lVar3 = *(long *)((long)pvVar9 + lVar10 * 2 + lVar14);
                        dVar20 = (double)*(float *)(local_c0 + -4 + lVar10 * 2);
                        dVar21 = (double)*(float *)(local_c0 + lVar10 * 2);
                        goto LAB_00142ab9;
                      case 0x3ef:
                        dVar20 = *(double *)(local_b8 + -8 + lVar10 * 4);
                        dVar21 = *(double *)(local_b8 + lVar10 * 4);
                        lVar3 = *(long *)((long)pvVar9 + lVar10 * 2 + lVar14);
LAB_00142ab9:
                        fprintf(__stream,local_108,dVar20,dVar21,lVar17,lVar3 + 1);
                      }
switchD_00142a31_caseD_3eb:
                      lVar10 = lVar10 + 4;
                      lVar18 = lVar18 + -1;
                    } while (lVar18 != 0);
                  }
                }
                iVar6 = (int)local_a0 + *(int *)((long)local_128 + (long)local_48 * 4);
                pcVar15 = local_98 + 1;
              } while (pcVar15 != local_78);
            }
            local_110 = local_110 + 1;
            iVar6 = *(int *)((long)local_d0 + local_130 * 4);
            pvVar8 = local_138;
            pvVar9 = local_d0;
            IVar7 = local_130;
          } while (local_110 < (*(int *)((long)local_138 + local_130 * 4) - iVar6) + 1);
        }
        free(local_118);
        free(local_c8);
        free(local_a8);
        IVar7 = IVar7 + 1;
        lVar17 = local_e0;
      } while (IVar7 != local_148);
    }
    fclose(__stream);
  }
  free(pvVar9);
  free(pvVar8);
  free(local_140);
  free(local_120);
  free(local_128);
  pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + lVar17));
  return;
}

Assistant:

void pnga_sprs_array_export(Integer s_a, const char* file)
{
  Integer hdl = GA_OFFSET + s_a;
  int size  = SPA[hdl].size;
  int type = SPA[hdl].type;
  int local_sync_begin,local_sync_end;
  char frmt[32];
  char *cptr;
  int offset;
  Integer nlen_data;
  Integer nlen_j;
  Integer nlen_i;
  Integer irow;
  int idx_size = SPA[hdl].idx_size;
  void *vptr;
  void *iptr;
  void *jptr;
  Integer lo, hi, ld;
  char op[2];
  FILE *SPRS;
  int *ilo, *ihi, *nblock;
  Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl].grp);
  Integer iproc, iblock;
  Integer nblocks;
  int *istart;
  int icnt;
  Integer g_blks;
  Integer one = 1;
  Integer total;
  int *blkmap;
  int *blkoffset;
  int *blksize;
  int64_t nnz;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl].grp);

  /* find the total number of nonzero elements on each process */
  nnz = 0;
  for (iproc = 0; iproc<nprocs; iproc++) {
    pnga_distribution(SPA[hdl].g_data,iproc,&lo,&hi);
    if (hi > nnz) nnz = hi;
  }

  /* find low and hi row indices on each processor */
  ilo = (int*)malloc(nprocs*sizeof(int));
  ihi = (int*)malloc(nprocs*sizeof(int));
  nblock = (int*)malloc(nprocs*sizeof(int));
  for (iproc=0; iproc<nprocs; iproc++) {
    ilo[iproc] = 0;
    ihi[iproc] = 0;
    nblock[iproc] = 0;
  }
  ilo[me] = (int)SPA[hdl].ilo;
  ihi[me] = (int)SPA[hdl].ihi;
  nblock[me] = (int)SPA[hdl].nblocks;
  op[0] = '+';
  op[1] = '\0';
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,ilo,nprocs,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,ihi,nprocs,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,nblock,nprocs,op);
  /* construct a map of all blocks */
  nblocks = 0;
  blkoffset = (int*)malloc(nprocs*sizeof(int));
  for (iproc=0; iproc<nprocs; iproc++) nblocks += nblock[iproc];
  blkmap = (int*)malloc(nblocks*sizeof(int));
  blksize = (int*)malloc(nblocks*sizeof(int));
  blkoffset[0] = 0;
  for (iproc=1; iproc<nprocs; iproc++) {
    blkoffset[iproc] = blkoffset[iproc-1]+nblock[iproc-1];
  }
  for (iproc=0; iproc<nblocks; iproc++) {
    blkmap[iproc] = 0;
    blksize[iproc] = 0;
  }
  for (iproc=0; iproc<nblock[me]; iproc++) {
    blkmap[iproc+blkoffset[me]] = SPA[hdl].blkidx[iproc];
    blksize[iproc+blkoffset[me]] = SPA[hdl].blksize[iproc];
  }
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,blkmap,nblocks,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,blksize,nblocks,op);
  /* format print statement */
  if (idx_size == 4) {
    strncpy(frmt,"\%d \%d",5);
    offset = 5;
  } else {
    strncpy(frmt,"\%ld \%ld",7);
    offset = 7;
  }
  cptr = frmt+offset;
  if (type == C_FLOAT || type == C_DBL) {
    strncpy(cptr," \%14.6e",7);
    offset = 7;
  } else if (type == C_INT) {
    strncpy(cptr," \%d",3);
    offset = 3;
  } else if (type == C_LONG) {
    strncpy(cptr," \%ld",4);
    offset = 4;
  } else if (type == C_SCPL || type == C_DCPL) {
    strncpy(cptr," \%14.6e \%14.6e",14);
    offset = 14;
  } 
  cptr += offset;
  cptr[0] = '\n';
  cptr++;
  cptr[0] = '\0';

  if (me == 0) {
    /* open file */
    SPRS = fopen(file,"w");
    fprintf(SPRS,"\%\%MatrixMarket matrix coordinate real general\n");
    fprintf(SPRS,"%ld %ld %ld\n",SPA[hdl].idim, SPA[hdl].jdim, nnz);
    /* Loop over all row blocks */
    for (iproc = 0; iproc<nprocs; iproc++) {
      /* find out how much data is on each process, allocate
       * local buffers to hold it and copy data to local buffer */
      /* Copy data from global arrays to local buffers */
      Integer iilo, iihi, istride, ioffset, itop;
      int ibl;
      ld = 1;
      pnga_distribution(SPA[hdl].g_data, iproc, &lo, &hi);
      nlen_data = hi-lo+1;
      vptr = malloc(nlen_data*size);
      pnga_get(SPA[hdl].g_data,&lo,&hi,vptr,&ld);

      pnga_distribution(SPA[hdl].g_i, iproc, &lo, &hi);
      nlen_i = hi-lo+1;
      iptr = malloc(nlen_i*idx_size);
      pnga_get(SPA[hdl].g_i,&lo,&hi,iptr,&ld);

      pnga_distribution(SPA[hdl].g_j, iproc, &lo, &hi);
      nlen_j = hi-lo+1;
      jptr = malloc(nlen_j*idx_size);
      pnga_get(SPA[hdl].g_j,&lo,&hi,jptr,&ld);

      nblocks = nblock[iproc];
      /* loop over rows. Not the most efficient way of printing out information
       * but makes output slightly neater */
      istride = ihi[iproc]-ilo[iproc]+2;
      for (irow = 0; irow<(ihi[iproc]-ilo[iproc]+1); irow++) {
        int loffset = 0;
        iilo = irow+ilo[iproc];
        for (ibl = 0; ibl<nblocks; ibl++) {
          Integer j, k;
          Integer jlo, jhi, nblk;
          nblk = (Integer)blkmap[blkoffset[iproc]+ibl];
          pnga_sprs_array_column_distribution(s_a,nblk,&jlo,&jhi);
          ioffset = ibl*istride+irow;
          if (idx_size == 4) {
            int *idx = (int*)iptr;
            int *jdx = (int*)jptr+loffset;
            int tlo = idx[ioffset];
            int thi = idx[ioffset+1];
            for (k=tlo; k<thi; k++) {
              if (type == C_FLOAT) {
                float val = ((float*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_DBL) {
                double val = ((double*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_INT) {
                int val = ((int*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_LONG) {
                int64_t val = ((int64_t*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_SCPL) {
                float rval = ((float*)vptr)[2*k+loffset];
                float ival = ((float*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              } else if (type == C_DCPL) {
                double rval = ((double*)vptr)[2*k+loffset];
                double ival = ((double*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              }
            }
          } else {
            int64_t *idx = (int64_t*)iptr;
            int64_t *jdx = (int64_t*)jptr+loffset;
            int64_t tlo = idx[ioffset];
            int64_t thi = idx[ioffset+1];
            for (k=tlo; k<thi; k++) {
              if (type == C_FLOAT) {
                float val = ((float*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_DBL) {
                double val = ((double*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_INT) {
                int val = ((int*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_LONG) {
                int64_t val = ((int64_t*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_SCPL) {
                float rval = ((float*)vptr)[2*k+loffset];
                float ival = ((float*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              } else if (type == C_DCPL) {
                double rval = ((double*)vptr)[2*k+loffset];
                double ival = ((double*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              }
            }
          }
          loffset += blksize[blkoffset[iproc]+ibl];
        }
      }
      /* free local buffers */
      free(vptr);
      free(jptr);
      free(iptr);
    }
    fclose(SPRS);
  }
  free(ilo);
  free(ihi);
  free(nblock);
  free(blkmap);
  free(blksize);
  pnga_pgroup_sync(SPA[hdl].grp);
}